

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

uint8 * __thiscall
sentencepiece::ModelProto::_InternalSerialize
          (ModelProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TrainerSpec *this_00;
  NormalizerSpec *pNVar2;
  SelfTestData *this_01;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Type *this_02;
  uint uVar8;
  int index;
  undefined8 *puVar9;
  size_t __n;
  uint8 *puVar10;
  uint8 *puVar11;
  
  iVar1 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                          (&(this->pieces_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar8 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar5 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar5);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = ModelProto_SentencePiece::_InternalSerialize(this_02,puVar10,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->trainer_spec_;
    *target = '\x12';
    uVar7 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)(uVar7 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar7 = uVar7 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          puVar10 = puVar11 + 1;
          bVar5 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar5);
        *puVar11 = (uint8)uVar6;
      }
    }
    target = TrainerSpec::_InternalSerialize(this_00,puVar10,stream);
  }
  if ((uVar8 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar2 = this->normalizer_spec_;
    *target = '\x1a';
    uVar7 = (pNVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)(uVar7 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar7 = uVar7 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          puVar10 = puVar11 + 1;
          bVar5 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar5);
        *puVar11 = (uint8)uVar6;
      }
    }
    target = NormalizerSpec::_InternalSerialize(pNVar2,puVar10,stream);
  }
  if ((uVar8 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->self_test_data_;
    *target = '\"';
    uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)(uVar7 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar7 = uVar7 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          puVar10 = puVar11 + 1;
          bVar5 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar5);
        *puVar11 = (uint8)uVar6;
      }
    }
    target = SelfTestData::_InternalSerialize(this_01,puVar10,stream);
  }
  if ((uVar8 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar2 = this->denormalizer_spec_;
    *target = '*';
    uVar8 = (pNVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar8 < 0x80) {
      target[1] = (byte)uVar8;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      if (uVar8 < 0x4000) {
        target[2] = (uint8)(uVar8 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar8 = uVar8 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          puVar10 = puVar11 + 1;
          bVar5 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar5);
        *puVar11 = (uint8)uVar7;
      }
    }
    target = NormalizerSpec::_InternalSerialize(pNVar2,puVar10,stream);
  }
  puVar10 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                      (&this->_extensions_,200,0x20000000,target,stream);
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    pvVar3 = *(void **)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      puVar9 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar9 = (undefined8 *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    }
    __n = (size_t)(int)puVar9[1];
    if ((long)stream->end_ - (long)puVar10 < (long)__n) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                          (stream,pvVar3,(int)puVar9[1],puVar10);
      return puVar10;
    }
    memcpy(puVar10,pvVar3,__n);
    puVar10 = puVar10 + __n;
  }
  return puVar10;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_pieces(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional .sentencepiece.TrainerSpec trainer_spec = 2;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::trainer_spec(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::normalizer_spec(this), target, stream);
  }

  // optional .sentencepiece.SelfTestData self_test_data = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::self_test_data(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::denormalizer_spec(this), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto)
  return target;
}